

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

int stbi_write_png(char *filename,int x,int y,int comp,void *data,int stride_bytes)

{
  uchar *__ptr;
  FILE *__s;
  char *in_RDI;
  uchar *png;
  int len;
  FILE *f;
  int *in_stack_00000070;
  int in_stack_00000078;
  int in_stack_0000007c;
  int in_stack_00000080;
  int in_stack_00000084;
  uchar *in_stack_00000088;
  int local_3c;
  int local_4;
  
  __ptr = stbi_write_png_to_mem
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_0000007c,
                     in_stack_00000078,in_stack_00000070);
  if (__ptr == (uchar *)0x0) {
    local_4 = 0;
  }
  else {
    __s = fopen(in_RDI,"wb");
    if (__s == (FILE *)0x0) {
      free(__ptr);
      local_4 = 0;
    }
    else {
      fwrite(__ptr,1,(long)local_3c,__s);
      fclose(__s);
      free(__ptr);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

STBIWDEF int stbi_write_png(char const *filename, int x, int y, int comp, const void *data, int stride_bytes)
{
   FILE *f;
   int len;
   unsigned char *png = stbi_write_png_to_mem((unsigned char *) data, stride_bytes, x, y, comp, &len);
   if (png == NULL) return 0;
   f = fopen(filename, "wb");
   if (!f) { STBIW_FREE(png); return 0; }
   fwrite(png, 1, len, f);
   fclose(f);
   STBIW_FREE(png);
   return 1;
}